

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_top_k(ggml_context *ctx,ggml_tensor *a,int k)

{
  ggml_tensor *pgVar1;
  
  if ((long)k <= a->ne[0]) {
    pgVar1 = ggml_argsort(ctx,a,GGML_SORT_ORDER_DESC);
    pgVar1 = ggml_view_4d(ctx,pgVar1,(long)k,pgVar1->ne[1],pgVar1->ne[2],pgVar1->ne[3],pgVar1->nb[1]
                          ,pgVar1->nb[2],pgVar1->nb[3],0);
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x111e,
             "GGML_ASSERT(%s) failed","a->ne[0] >= k");
}

Assistant:

struct ggml_tensor * ggml_top_k(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   k) {
    GGML_ASSERT(a->ne[0] >= k);

    struct ggml_tensor * result = ggml_argsort(ctx, a, GGML_SORT_ORDER_DESC);

    result = ggml_view_4d(ctx, result,
                k, result->ne[1], result->ne[2], result->ne[3],
                   result->nb[1], result->nb[2], result->nb[3],
                0);

    return result;
}